

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

linked_ptr<const_testing::MatcherInterface<fmt::v5::basic_string_view<wchar_t>_>_> * __thiscall
testing::internal::
linked_ptr<const_testing::MatcherInterface<fmt::v5::basic_string_view<wchar_t>_>_>::operator=
          (linked_ptr<const_testing::MatcherInterface<fmt::v5::basic_string_view<wchar_t>_>_> *this,
          linked_ptr<const_testing::MatcherInterface<fmt::v5::basic_string_view<wchar_t>_>_> *ptr)

{
  linked_ptr<const_testing::MatcherInterface<fmt::v5::basic_string_view<wchar_t>_>_> *in_RSI;
  linked_ptr<const_testing::MatcherInterface<fmt::v5::basic_string_view<wchar_t>_>_> *in_RDI;
  
  if (in_RSI != in_RDI) {
    depart(in_RSI);
    linked_ptr<testing::MatcherInterface<fmt::v5::basic_string_view<wchar_t>>const>::
    copy<testing::MatcherInterface<fmt::v5::basic_string_view<wchar_t>>const>(in_RSI,in_RDI);
  }
  return in_RDI;
}

Assistant:

linked_ptr& operator=(linked_ptr const& ptr) {
    if (&ptr != this) {
      depart();
      copy(&ptr);
    }
    return *this;
  }